

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

int lws_sa46_on_net(lws_sockaddr46 *sa46a,lws_sockaddr46 *sa46_net,int net_len)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  iVar1 = 1;
  if (((sa46a->sa4).sin_family == 2) && ((sa46_net->sa4).sin_family == 2)) {
    iVar1 = -net_len;
    uVar3 = 0xff;
    lVar2 = 4;
    while (iVar1 = iVar1 + 8, 0 < net_len) {
      uVar4 = uVar3 & 0xff;
      bVar5 = 7 < (uint)net_len;
      net_len = net_len - 8;
      uVar3 = uVar4 << ((byte)iVar1 & 0x1f);
      if (bVar5) {
        uVar3 = uVar4;
      }
      if ((byte)((*(byte *)((long)sa46_net + lVar2) ^ *(byte *)((long)sa46a + lVar2)) & (byte)uVar3)
          != 0) {
        return 1;
      }
      lVar2 = lVar2 + 1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
lws_sa46_on_net(const lws_sockaddr46 *sa46a, const lws_sockaddr46 *sa46_net,
		int net_len)
{
	uint8_t mask = 0xff, norm[16];
	const uint8_t *p1, *p2;

	if (sa46a->sa4.sin_family == AF_INET) {
		p1 = (uint8_t *)&sa46a->sa4.sin_addr;
		if (sa46_net->sa4.sin_family == AF_INET6) {
			/* ip is v4, net is v6, promote ip to v6 */

			lws_4to6(norm, p1);
			p1 = norm;
		}
#if defined(LWS_WITH_IPV6)
	} else
		if (sa46a->sa4.sin_family == AF_INET6) {
			p1 = (uint8_t *)&sa46a->sa6.sin6_addr;
#endif
		} else
			return 1;

	if (sa46_net->sa4.sin_family == AF_INET) {
		p2 = (uint8_t *)&sa46_net->sa4.sin_addr;
		if (sa46a->sa4.sin_family == AF_INET6) {
			/* ip is v6, net is v4, promote net to v6 */

			lws_4to6(norm, p2);
			p2 = norm;
			/* because the mask length is for net v4 address */
			net_len += 12 * 8;
		}
#if defined(LWS_WITH_IPV6)
	} else
		if (sa46a->sa4.sin_family == AF_INET6) {
			p2 = (uint8_t *)&sa46_net->sa6.sin6_addr;
#endif
		} else
			return 1;

	while (net_len > 0) {
		if (net_len < 8)
			mask = (uint8_t)(mask << (8 - net_len));

		if (((*p1++) & mask) != ((*p2++) & mask))
			return 1;

		net_len -= 8;
	}

	return 0;
}